

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O0

Real N_VDotProd_MultiFab(N_Vector x,N_Vector y)

{
  FabArrayBase *this;
  MultiFab **ppMVar1;
  N_Vector in_RSI;
  N_Vector in_RDI;
  Real RVar2;
  Real dotproduct;
  sunindextype nghost;
  sunindextype ncomp;
  MultiFab *mf_y;
  MultiFab *mf_x;
  bool in_stack_00000153;
  int in_stack_00000154;
  int in_stack_00000158;
  int in_stack_0000015c;
  MultiFab *in_stack_00000160;
  int in_stack_0000016c;
  MultiFab *in_stack_00000170;
  
  ppMVar1 = amrex::sundials::getMFptr(in_RDI);
  this = (FabArrayBase *)*ppMVar1;
  amrex::sundials::getMFptr(in_RSI);
  amrex::FabArrayBase::nComp(this);
  RVar2 = amrex::MultiFab::Dot
                    (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                     in_stack_00000158,in_stack_00000154,in_stack_00000153);
  return RVar2;
}

Assistant:

amrex::Real N_VDotProd_MultiFab(N_Vector x, N_Vector y)
{
    using namespace amrex;

    MultiFab *mf_x = amrex::sundials::getMFptr(x);
    MultiFab *mf_y = amrex::sundials::getMFptr(y);
    sunindextype ncomp = mf_x->nComp();
    //sunindextype nghost = mf_x->nGrow();
    sunindextype nghost = 0;  // do not include ghost cells in dot product

    amrex::Real dotproduct = amrex::MultiFab::Dot(*mf_x, 0, *mf_y, 0, ncomp, nghost);

    return dotproduct;
}